

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O2

void IlmThread_3_4::anon_unknown_5::handleProcessTask(Task *task)

{
  TaskGroup *this;
  
  if (task != (Task *)0x0) {
    this = task->_group;
    (*task->_vptr_Task[2])();
    (*task->_vptr_Task[1])(task);
    if (this != (TaskGroup *)0x0) {
      TaskGroup::finishOneTask(this);
      return;
    }
  }
  return;
}

Assistant:

static inline void
handleProcessTask (Task* task)
{
    if (task)
    {
        TaskGroup* taskGroup = task->group ();

        task->execute ();

        // kill the task prior to notifying the group
        // such that any internal reference-based
        // semantics will be handled prior to
        // the task group destructor letting it out
        // of the scope of those references
        delete task;

        if (taskGroup) taskGroup->finishOneTask ();
    }
}